

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall
Highs::changeColsCost(Highs *this,HighsInt num_set_entries,HighsInt *set,double *cost)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  string method;
  bool bVar2;
  HighsInt HVar3;
  HighsStatus HVar4;
  vector<int,_std::allocator<int>_> local_set;
  vector<double,_std::allocator<double>_> local_cost;
  HighsIndexCollection index_collection;
  undefined4 uVar5;
  undefined8 uVar6;
  HighsLogOptions *log_options;
  Highs *pHVar7;
  vector<int,_std::allocator<int>_> local_1d8;
  double *local_1c0 [3];
  string local_1a8;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  string local_168;
  HighsIndexCollection local_148;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  if (num_set_entries == 0) {
    HVar4 = kOk;
  }
  else {
    log_options = &(this->options_).super_HighsOptionsStruct.log_options;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"column costs","");
    bVar2 = doubleUserDataNotNull(log_options,cost,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    HVar4 = kError;
    if (!bVar2) {
      pHVar7 = this;
      clearDerivedModelProperties(this);
      std::vector<double,std::allocator<double>>::vector<double_const*,void>
                ((vector<double,std::allocator<double>> *)local_1c0,cost,cost + num_set_entries,
                 (allocator_type *)&local_148);
      std::vector<int,std::allocator<int>>::vector<int_const*,void>
                ((vector<int,std::allocator<int>> *)&local_1d8,set,set + num_set_entries,
                 (allocator_type *)&local_148);
      uVar5 = 0;
      uVar6 = 0;
      sortSetData(num_set_entries,&local_1d8,cost,(double *)0x0,(double *)0x0,local_1c0[0],
                  (double *)0x0,(double *)0x0);
      local_148.dimension_ = -1;
      local_148.is_interval_ = false;
      local_148.from_ = -1;
      local_148.to_ = -2;
      local_148.is_set_ = false;
      local_148.set_num_entries_ = -1;
      local_148.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_148.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_1_ = 0;
      local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._1_7_ = 0;
      local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_1_ = 0;
      local_148._41_8_ = 0;
      HVar3 = create(&local_148,num_set_entries,
                     local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(this->model_).lp_.num_col_);
      if (HVar3 == 0) {
        HVar4 = changeCostsInterface(this,&local_148,local_1c0[0]);
        local_f8.log_stream = log_options->log_stream;
        local_f8.output_flag = log_options->output_flag;
        local_f8.log_to_console = log_options->log_to_console;
        local_f8.log_dev_level = log_options->log_dev_level;
        local_f8.user_log_callback = log_options->user_log_callback;
        local_f8.user_log_callback_data = log_options->user_log_callback_data;
        pfVar1 = &local_f8.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
        local_f8.user_callback_active =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
        local_f8.user_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"changeCosts","");
        HVar4 = interpretCallStatus(&local_f8,HVar4,kOk,&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_f8.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        if (HVar4 == kError) {
          HVar4 = kError;
        }
        else {
          HVar4 = returnFromHighs(this,HVar4);
        }
      }
      else {
        local_98.log_stream = log_options->log_stream;
        local_98.output_flag = log_options->output_flag;
        local_98.log_to_console = log_options->log_to_console;
        local_98.log_dev_level = log_options->log_dev_level;
        local_98.user_log_callback = log_options->user_log_callback;
        local_98.user_log_callback_data = log_options->user_log_callback_data;
        pfVar1 = &local_98.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
        local_98.user_callback_active =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
        local_98.user_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
        local_188[0] = local_178;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"changeColsCost","");
        method._M_dataplus._M_p._4_4_ = uVar5;
        method._M_dataplus._M_p._0_4_ = (this->model_).lp_.num_col_;
        method._M_string_length = uVar6;
        method.field_2._M_allocated_capacity = (size_type)log_options;
        method.field_2._8_8_ = pHVar7;
        analyseSetCreateError
                  (&local_98,method,(HighsInt)local_188[0],SUB41(HVar3,0),1,
                   (HighsInt *)(ulong)(uint)num_set_entries,
                   (HighsInt)
                   local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
        if (local_188[0] != local_178) {
          operator_delete(local_188[0]);
        }
        HVar4 = kError;
        if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_98.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
      }
      if (local_148.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (HighsInt *)0x0) {
        operator_delete(local_1d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_1c0[0] != (double *)0x0) {
        operator_delete(local_1c0[0]);
      }
    }
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::changeColsCost(const HighsInt num_set_entries,
                                  const HighsInt* set, const double* cost) {
  if (num_set_entries == 0) return HighsStatus::kOk;
  // Check for NULL data in "set" version of changeColsCost since
  // values are sorted with set
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  clearDerivedModelProperties();
  // Ensure that the set and data are in ascending order
  std::vector<double> local_cost{cost, cost + num_set_entries};
  std::vector<HighsInt> local_set{set, set + num_set_entries};
  sortSetData(num_set_entries, local_set, cost, NULL, NULL, local_cost.data(),
              NULL, NULL);
  HighsIndexCollection index_collection;
  const HighsInt create_error = create(index_collection, num_set_entries,
                                       local_set.data(), model_.lp_.num_col_);
  if (create_error)
    return analyseSetCreateError(options_.log_options, "changeColsCost",
                                 create_error, true, num_set_entries,
                                 local_set.data(), model_.lp_.num_col_);
  HighsStatus call_status =
      changeCostsInterface(index_collection, local_cost.data());
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeCosts");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}